

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDfsLitArray(Gia_Man_t *p,Vec_Int_t *vLits)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCi(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
  }
  for (iVar6 = 0; iVar6 < vLits->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(vLits,iVar6);
    iVar3 = Abc_Lit2Var(iVar2);
    pGVar5 = Gia_ManObj(p,iVar3);
    iVar3 = Gia_ManDupDfs2_rec(p_00,p,pGVar5);
    iVar2 = Abc_LitIsCompl(iVar2);
    iVar2 = Abc_LitNotCond(iVar3,iVar2);
    Gia_ManAppendCo(p_00,iVar2);
  }
  Gia_ManSetRegNum(p_00,0);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsLitArray( Gia_Man_t * p, Vec_Int_t * vLits )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iLit, iLitRes;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_IntForEachEntry( vLits, iLit, i )
    {
        iLitRes = Gia_ManDupDfs2_rec( pNew, p, Gia_ManObj(p, Abc_Lit2Var(iLit)) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond( iLitRes, Abc_LitIsCompl(iLit)) );
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}